

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

GLuint add_shader_file(GLuint p_id,string *p_filepath,string *p_content,ShaderType *p_type)

{
  ShaderFile local_c0;
  pair<unsigned_int,_ShaderFile> local_78;
  ShaderType *local_28;
  ShaderType *p_type_local;
  string *p_content_local;
  string *p_filepath_local;
  GLuint p_id_local;
  
  local_28 = p_type;
  p_type_local = (ShaderType *)p_content;
  p_content_local = p_filepath;
  p_filepath_local._4_4_ = p_id;
  ShaderFile::ShaderFile(&local_c0,p_filepath,p_content,*p_type);
  std::make_pair<unsigned_int_const&,ShaderFile>
            (&local_78,(uint *)((long)&p_filepath_local + 4),&local_c0);
  std::
  unordered_map<unsigned_int,ShaderFile,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ShaderFile>>>
  ::emplace<std::pair<unsigned_int,ShaderFile>>
            ((unordered_map<unsigned_int,ShaderFile,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ShaderFile>>>
              *)ShaderDb::file_map,&local_78);
  std::pair<unsigned_int,_ShaderFile>::~pair(&local_78);
  ShaderFile::~ShaderFile(&local_c0);
  return p_filepath_local._4_4_;
}

Assistant:

GLuint add_shader_file(
    const GLuint p_id,
    const std::string &p_filepath,
    const std::string &p_content,
    const ShaderType &p_type) noexcept
{
    ShaderDb::file_map.emplace(
        std::make_pair(
            p_id,
            ShaderFile(p_filepath,
                       p_content,
                       p_type)));

    return p_id;
}